

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O2

void ncnn::pack_B_tile_int8_avxvnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [32];
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM6 [64];
  
  iVar6 = cpu_support_x86_avx_vnni_int8();
  auVar5 = _DAT_00540aa0;
  if (iVar6 != 0) {
    pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
    return;
  }
  pauVar11 = (undefined1 (*) [32])BT->data;
  lVar7 = (long)k;
  lVar8 = (long)j;
  lVar9 = (long)max_jj;
  lVar12 = lVar8 + 1;
  uVar10 = 0;
  auVar3 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar17[8] = 0x7f;
  auVar17._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar17[9] = 0x7f;
  auVar17[10] = 0x7f;
  auVar17[0xb] = 0x7f;
  auVar17[0xc] = 0x7f;
  auVar17[0xd] = 0x7f;
  auVar17[0xe] = 0x7f;
  auVar17[0xf] = 0x7f;
  auVar17[0x10] = 0x7f;
  auVar17[0x11] = 0x7f;
  auVar17[0x12] = 0x7f;
  auVar17[0x13] = 0x7f;
  auVar17[0x14] = 0x7f;
  auVar17[0x15] = 0x7f;
  auVar17[0x16] = 0x7f;
  auVar17[0x17] = 0x7f;
  auVar17[0x18] = 0x7f;
  auVar17[0x19] = 0x7f;
  auVar17[0x1a] = 0x7f;
  auVar17[0x1b] = 0x7f;
  auVar17[0x1c] = 0x7f;
  auVar17[0x1d] = 0x7f;
  auVar17[0x1e] = 0x7f;
  auVar17[0x1f] = 0x7f;
  auVar18._8_4_ = 0xc080400;
  auVar18._0_8_ = 0xc0804000c080400;
  auVar18._12_4_ = 0xc080400;
  auVar18._16_4_ = 0xc080400;
  auVar18._20_4_ = 0xc080400;
  auVar18._24_4_ = 0xc080400;
  auVar18._28_4_ = 0xc080400;
  for (; (long)(uVar10 | 7) < lVar9; uVar10 = uVar10 + 8) {
    iVar6 = B->w;
    auVar20._4_4_ = iVar6;
    auVar20._0_4_ = iVar6;
    auVar20._8_4_ = iVar6;
    auVar20._12_4_ = iVar6;
    auVar20._16_4_ = iVar6;
    auVar20._20_4_ = iVar6;
    auVar20._24_4_ = iVar6;
    auVar20._28_4_ = iVar6;
    vpmulld_avx2(auVar20,auVar3);
    for (iVar6 = 0; iVar6 + 3 < max_kk; iVar6 = iVar6 + 4) {
      auVar20 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
      auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
      in_ZMM6 = ZEXT3264((undefined1  [32])0x0);
      auVar20 = vpaddb_avx2(auVar20,auVar17);
      in_ZMM5 = ZEXT3264(auVar20);
      *pauVar11 = auVar20;
      pauVar11 = pauVar11 + 1;
    }
    for (; iVar6 + 1 < max_kk; iVar6 = iVar6 + 2) {
      auVar20 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
      auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
      in_ZMM6 = ZEXT3264((undefined1  [32])0x0);
      auVar20 = vpshufb_avx2(auVar20,auVar5);
      auVar20 = vpermq_avx2(auVar20,0xe8);
      in_ZMM5 = ZEXT3264(auVar20);
      *(undefined1 (*) [16])*pauVar11 = auVar20._0_16_;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
    }
    for (; iVar6 < max_kk; iVar6 = iVar6 + 1) {
      auVar20 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
      auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
      auVar20 = vpshufb_avx2(auVar20,auVar18);
      in_ZMM6 = ZEXT1664(auVar20._16_16_);
      auVar2 = vpunpckldq_avx(auVar20._0_16_,auVar20._16_16_);
      in_ZMM5 = ZEXT1664(auVar2);
      *(long *)*pauVar11 = auVar2._0_8_;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
    }
    lVar8 = lVar8 + 8;
    lVar12 = lVar12 + 8;
  }
  auVar2 = vpmovsxbd_avx(ZEXT416(0x3020100));
  auVar16[8] = 0x7f;
  auVar16._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar16[9] = 0x7f;
  auVar16[10] = 0x7f;
  auVar16[0xb] = 0x7f;
  auVar16[0xc] = 0x7f;
  auVar16[0xd] = 0x7f;
  auVar16[0xe] = 0x7f;
  auVar16[0xf] = 0x7f;
  for (; (long)(uVar10 | 3) < lVar9; uVar10 = uVar10 + 4) {
    iVar6 = B->w;
    auVar19._4_4_ = iVar6;
    auVar19._0_4_ = iVar6;
    auVar19._8_4_ = iVar6;
    auVar19._12_4_ = iVar6;
    vpmulld_avx(auVar19,auVar2);
    for (iVar6 = 0; iVar6 + 3 < max_kk; iVar6 = iVar6 + 4) {
      auVar19 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
      auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
      auVar19 = vpaddb_avx(auVar19,auVar16);
      in_ZMM5 = ZEXT1664(auVar19);
      *(undefined1 (*) [16])*pauVar11 = auVar19;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
    }
    for (; iVar6 + 1 < max_kk; iVar6 = iVar6 + 2) {
      auVar19 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
      auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
      auVar19 = vpshufb_avx(auVar19,ZEXT816(0xd0c090805040100));
      in_ZMM5 = ZEXT1664(auVar19);
      *(long *)*pauVar11 = auVar19._0_8_;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
    }
    for (; iVar6 < max_kk; iVar6 = iVar6 + 1) {
      auVar19 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
      auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
      auVar19 = vpshufb_avx(auVar19,SUB6416(ZEXT464(0xc080400),0));
      in_ZMM5 = ZEXT1664(auVar19);
      *(int *)*pauVar11 = auVar19._0_4_;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
    }
    lVar8 = lVar8 + 4;
    lVar12 = lVar12 + 4;
  }
  for (; (long)(uVar10 | 1) < lVar9; uVar10 = uVar10 + 2) {
    pvVar1 = B->data;
    lVar13 = B->elemsize * lVar8 * (long)B->w + lVar7;
    lVar4 = B->elemsize * lVar12 * (long)B->w + lVar7;
    pauVar14 = pauVar11;
    for (lVar15 = 0; (int)lVar15 + 3 < max_kk; lVar15 = lVar15 + 4) {
      (*pauVar11)[lVar15 * 2] = *(char *)((long)pvVar1 + lVar15 + lVar13) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 1] = *(char *)((long)pvVar1 + lVar15 + lVar13 + 1) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 2] = *(char *)((long)pvVar1 + lVar15 + lVar13 + 2) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 3] = *(char *)((long)pvVar1 + lVar15 + lVar13 + 3) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 4] = *(char *)((long)pvVar1 + lVar15 + lVar4) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 5] = *(char *)((long)pvVar1 + lVar15 + lVar4 + 1) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 6] = *(char *)((long)pvVar1 + lVar15 + lVar4 + 2) + '\x7f';
      (*pauVar11)[lVar15 * 2 + 7] = *(char *)((long)pvVar1 + lVar15 + lVar4 + 3) + '\x7f';
      pauVar14 = (undefined1 (*) [32])(*pauVar14 + 8);
    }
    for (; (int)lVar15 + 1 < max_kk; lVar15 = lVar15 + 2) {
      (*pauVar11)[lVar15 * 2] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar13);
      (*pauVar11)[lVar15 * 2 + 1] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar13 + 1);
      (*pauVar11)[lVar15 * 2 + 2] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar4);
      (*pauVar11)[lVar15 * 2 + 3] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar4 + 1);
      pauVar14 = (undefined1 (*) [32])(*pauVar14 + 4);
    }
    for (; pauVar11 = pauVar14, (int)lVar15 < max_kk; lVar15 = lVar15 + 1) {
      (*pauVar11)[0] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar13);
      (*pauVar11)[1] = *(undefined1 *)((long)pvVar1 + lVar15 + lVar4);
      pauVar14 = (undefined1 (*) [32])(*pauVar11 + 2);
    }
    lVar8 = lVar8 + 2;
    lVar12 = lVar12 + 2;
  }
  for (; (long)uVar10 < lVar9; uVar10 = uVar10 + 1) {
    pvVar1 = B->data;
    lVar12 = B->elemsize * lVar8 * (long)B->w + lVar7;
    for (lVar13 = 0; (int)lVar13 + 3 < max_kk; lVar13 = lVar13 + 4) {
      (*pauVar11)[lVar13] = *(char *)((long)pvVar1 + lVar13 + lVar12) + '\x7f';
      (*pauVar11)[lVar13 + 1] = *(char *)((long)pvVar1 + lVar13 + lVar12 + 1) + '\x7f';
      (*pauVar11)[lVar13 + 2] = *(char *)((long)pvVar1 + lVar13 + lVar12 + 2) + '\x7f';
      (*pauVar11)[lVar13 + 3] = *(char *)((long)pvVar1 + lVar13 + lVar12 + 3) + '\x7f';
    }
    for (; (int)lVar13 < max_kk; lVar13 = lVar13 + 1) {
      (*pauVar11)[lVar13] = *(undefined1 *)((long)pvVar1 + lVar13 + lVar12);
    }
    lVar8 = lVar8 + 1;
    pauVar11 = (undefined1 (*) [32])(*pauVar11 + lVar13);
  }
  return;
}

Assistant:

void pack_B_tile_int8_avxvnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}